

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_zero_copy_stream_test.cc
# Opt level: O0

void __thiscall
google::protobuf::io::internal::anon_unknown_0::TestZeroCopyInputStreamTest_SkipWorks_Test::TestBody
          (TestZeroCopyInputStreamTest_SkipWorks_Test *this)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> matcher;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>_>
  matcher_00;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>_>
  matcher_01;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>_>
  matcher_02;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>_>
  matcher_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *pcVar2;
  TestZeroCopyInputStream *copy;
  TestZeroCopyInputStream *copy_00;
  TestZeroCopyInputStream *copy_01;
  TestZeroCopyInputStream *copy_02;
  TestZeroCopyInputStream *copy_03;
  TestZeroCopyInputStream *copy_04;
  char *pcVar3;
  char (*pacVar4) [8];
  char (*in_stack_fffffffffffff5d0) [8];
  _Head_base<0UL,_const_char_*,_false> _Var5;
  _Head_base<0UL,_const_char_*,_false> in_stack_fffffffffffff5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_968;
  string local_8f8;
  AssertHelper local_8d8;
  Message local_8d0;
  bool local_8c1;
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_890;
  Message local_888;
  bool local_879;
  undefined1 local_878 [8];
  AssertionResult gtest_ar__5;
  Message local_860;
  TestZeroCopyInputStream local_858;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7f0;
  char local_7d1;
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_7a0;
  Message local_798;
  bool local_789;
  undefined1 local_788 [8];
  AssertionResult gtest_ar__4;
  Message local_770;
  TestZeroCopyInputStream local_768;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_700;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>_> local_6e8;
  char local_6c8 [32];
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_678;
  Message local_670;
  bool local_661;
  undefined1 local_660 [8];
  AssertionResult gtest_ar__3;
  Message local_648;
  TestZeroCopyInputStream local_640;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5d8;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>_>
  local_5c0;
  char local_598 [40];
  undefined1 local_570 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_540;
  Message local_538;
  bool local_529;
  undefined1 local_528 [8];
  AssertionResult gtest_ar__2;
  Message local_510;
  TestZeroCopyInputStream local_508;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4a0;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>_>
  local_488;
  char local_458 [48];
  undefined1 local_428 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_3f8;
  Message local_3f0;
  bool local_3e1;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar__1;
  Message local_3c8;
  TestZeroCopyInputStream local_3c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>_>
  local_340;
  char local_310 [48];
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_2b0;
  Message local_2a8;
  bool local_299;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_;
  Message local_280;
  TestZeroCopyInputStream local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>_>
  local_1f8;
  char local_1c8 [48];
  undefined1 local_198 [8];
  AssertionResult gtest_ar;
  TestZeroCopyInputStream stream;
  allocator<char> local_118;
  allocator<char> local_117;
  allocator<char> local_116;
  allocator<char> local_115 [20];
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  TestZeroCopyInputStreamTest_SkipWorks_Test *this_local;
  
  stream.byte_count_._6_1_ = 1;
  local_100 = &local_f8;
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"ABC",&local_101);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"D",local_115);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"EFG",&local_116);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,anon_var_dwarf_37cdd0 + 5,&local_117);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,anon_var_dwarf_37cdd0 + 5,&local_118);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"HIJKLMN",(allocator<char> *)((long)&stream.byte_count_ + 7));
  stream.byte_count_._6_1_ = 0;
  local_38 = &local_f8;
  local_30 = 6;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&stream.byte_count_ + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&stream.byte_count_ + 5));
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_968 = local_968 + -1;
    std::__cxx11::string::~string((string *)local_968);
  } while (local_968 != &local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&stream.byte_count_ + 7));
  std::allocator<char>::~allocator(&local_118);
  std::allocator<char>::~allocator(&local_117);
  std::allocator<char>::~allocator(&local_116);
  std::allocator<char>::~allocator(local_115);
  std::allocator<char>::~allocator(&local_101);
  TestZeroCopyInputStream::TestZeroCopyInputStream
            ((TestZeroCopyInputStream *)&gtest_ar.message_,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28);
  pcVar3 = anon_var_dwarf_37cdd0 + 5;
  testing::ElementsAre<char[4],char[2],char[4],char[1],char[1],char[8]>
            (&local_1f8,(testing *)"ABC",(char (*) [4])0x1db7ab4,(char (*) [2])"EFG",
             (char (*) [4])(anon_var_dwarf_37cdd0 + 5),(char (*) [1])(anon_var_dwarf_37cdd0 + 5),
             (char (*) [1])"HIJKLMN",in_stack_fffffffffffff5d0);
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<4UL,_const_char_*,_const_char_*>.super__Head_base<4UL,_const_char_*,_false>.
  _M_head_impl = local_1f8.matchers_.
                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
                 .
                 super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
                 .super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
                 super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
                 super__Head_base<3UL,_const_char_*,_false>._M_head_impl;
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<4UL,_const_char_*,_const_char_*>.super__Tuple_impl<5UL,_const_char_*>.
  super__Head_base<5UL,_const_char_*,_false>._M_head_impl =
       (_Head_base<5UL,_const_char_*,_false>)
       (_Head_base<5UL,_const_char_*,_false>)
       local_1f8.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<4UL,_const_char_*,_const_char_*>.super__Head_base<4UL,_const_char_*,_false>
       ._M_head_impl;
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<3UL,_const_char_*,_false>._M_head_impl =
       local_1f8.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Head_base<2UL,_const_char_*,_false>._M_head_impl;
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<2UL,_const_char_*,_false>._M_head_impl =
       local_1f8.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       local_1f8.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Head_base<0UL,_const_char_*,_false>._M_head_impl = in_stack_fffffffffffff5f8._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>>>
            (matcher_01);
  TestZeroCopyInputStream::TestZeroCopyInputStream
            (&local_278,(TestZeroCopyInputStream *)&gtest_ar.message_);
  internal::(anonymous_namespace)::ReadLeftoverDoNotConsumeInput_abi_cxx11_
            (&local_210,(_anonymous_namespace_ *)&local_278,copy);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>>>
  ::operator()(local_198,local_1c8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"ReadLeftoverDoNotConsumeInput(stream)");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_210);
  TestZeroCopyInputStream::~TestZeroCopyInputStream(&local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  pacVar4 = (char (*) [8])
            local_1f8.matchers_.
            super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
            .
            super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
            .super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
            super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
            super__Tuple_impl<4UL,_const_char_*,_const_char_*>.
            super__Head_base<4UL,_const_char_*,_false>._M_head_impl;
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/test_zero_copy_stream_test.cc"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_280);
    pacVar4 = (char (*) [8])
              local_1f8.matchers_.
              super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
              .
              super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
              .super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
              super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
              super__Tuple_impl<4UL,_const_char_*,_const_char_*>.
              super__Head_base<4UL,_const_char_*,_false>._M_head_impl;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_299 = TestZeroCopyInputStream::Skip((TestZeroCopyInputStream *)&gtest_ar.message_,0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_298,&local_299,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_298,
               (AssertionResult *)"stream.Skip(0)","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/test_zero_copy_stream_test.cc"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  pcVar3 = anon_var_dwarf_37cdd0 + 5;
  testing::ElementsAre<char[4],char[2],char[4],char[1],char[1],char[8]>
            (&local_340,(testing *)"ABC",(char (*) [4])0x1db7ab4,(char (*) [2])"EFG",
             (char (*) [4])(anon_var_dwarf_37cdd0 + 5),(char (*) [1])(anon_var_dwarf_37cdd0 + 5),
             (char (*) [1])"HIJKLMN",pacVar4);
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<4UL,_const_char_*,_const_char_*>.super__Head_base<4UL,_const_char_*,_false>.
  _M_head_impl = local_340.matchers_.
                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
                 .
                 super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
                 .super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
                 super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
                 super__Head_base<3UL,_const_char_*,_false>._M_head_impl;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<4UL,_const_char_*,_const_char_*>.super__Tuple_impl<5UL,_const_char_*>.
  super__Head_base<5UL,_const_char_*,_false>._M_head_impl =
       (_Head_base<5UL,_const_char_*,_false>)
       (_Head_base<5UL,_const_char_*,_false>)
       local_340.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<4UL,_const_char_*,_const_char_*>.super__Head_base<4UL,_const_char_*,_false>
       ._M_head_impl;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<3UL,_const_char_*,_false>._M_head_impl =
       local_340.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Head_base<2UL,_const_char_*,_false>._M_head_impl;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<2UL,_const_char_*,_false>._M_head_impl =
       local_340.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       local_340.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Head_base<0UL,_const_char_*,_false>._M_head_impl = in_stack_fffffffffffff5f8._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>>>
            (matcher_02);
  TestZeroCopyInputStream::TestZeroCopyInputStream
            (&local_3c0,(TestZeroCopyInputStream *)&gtest_ar.message_);
  internal::(anonymous_namespace)::ReadLeftoverDoNotConsumeInput_abi_cxx11_
            (&local_358,(_anonymous_namespace_ *)&local_3c0,copy_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>>>
  ::operator()(local_2e0,local_310,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"ReadLeftoverDoNotConsumeInput(stream)");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_358);
  TestZeroCopyInputStream::~TestZeroCopyInputStream(&local_3c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  pacVar4 = (char (*) [8])
            local_340.matchers_.
            super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
            .
            super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
            .super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
            super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
            super__Tuple_impl<4UL,_const_char_*,_const_char_*>.
            super__Head_base<4UL,_const_char_*,_false>._M_head_impl;
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/test_zero_copy_stream_test.cc"
               ,0x86,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_3c8);
    pacVar4 = (char (*) [8])
              local_340.matchers_.
              super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
              .
              super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
              .super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
              super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
              super__Tuple_impl<4UL,_const_char_*,_const_char_*>.
              super__Head_base<4UL,_const_char_*,_false>._M_head_impl;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  local_3e1 = TestZeroCopyInputStream::Skip((TestZeroCopyInputStream *)&gtest_ar.message_,1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3e0,&local_3e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_3f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_3e0,
               (AssertionResult *)"stream.Skip(1)","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/test_zero_copy_stream_test.cc"
               ,0x88,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  pcVar3 = anon_var_dwarf_37cdd0 + 5;
  testing::ElementsAre<char[3],char[2],char[4],char[1],char[1],char[8]>
            (&local_488,(testing *)0x1da91e6,(char (*) [3])0x1db7ab4,(char (*) [2])"EFG",
             (char (*) [4])(anon_var_dwarf_37cdd0 + 5),(char (*) [1])(anon_var_dwarf_37cdd0 + 5),
             (char (*) [1])"HIJKLMN",pacVar4);
  matcher_03.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<4UL,_const_char_*,_const_char_*>.super__Head_base<4UL,_const_char_*,_false>.
  _M_head_impl = local_488.matchers_.
                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
                 .
                 super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
                 .super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
                 super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
                 super__Head_base<3UL,_const_char_*,_false>._M_head_impl;
  matcher_03.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<4UL,_const_char_*,_const_char_*>.super__Tuple_impl<5UL,_const_char_*>.
  super__Head_base<5UL,_const_char_*,_false>._M_head_impl =
       (_Head_base<5UL,_const_char_*,_false>)
       (_Head_base<5UL,_const_char_*,_false>)
       local_488.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<4UL,_const_char_*,_const_char_*>.super__Head_base<4UL,_const_char_*,_false>
       ._M_head_impl;
  matcher_03.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<3UL,_const_char_*,_false>._M_head_impl =
       local_488.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Head_base<2UL,_const_char_*,_false>._M_head_impl;
  matcher_03.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<2UL,_const_char_*,_false>._M_head_impl =
       local_488.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  matcher_03.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       local_488.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  matcher_03.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  .super__Head_base<0UL,_const_char_*,_false>._M_head_impl = in_stack_fffffffffffff5f8._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>>>
            (matcher_03);
  TestZeroCopyInputStream::TestZeroCopyInputStream
            (&local_508,(TestZeroCopyInputStream *)&gtest_ar.message_);
  internal::(anonymous_namespace)::ReadLeftoverDoNotConsumeInput_abi_cxx11_
            (&local_4a0,(_anonymous_namespace_ *)&local_508,copy_01);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>>>
  ::operator()(local_428,local_458,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"ReadLeftoverDoNotConsumeInput(stream)");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4a0);
  TestZeroCopyInputStream::~TestZeroCopyInputStream(&local_508);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  pacVar4 = (char (*) [8])
            local_488.matchers_.
            super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
            .
            super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
            .super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
            super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
            super__Tuple_impl<4UL,_const_char_*,_const_char_*>.super__Tuple_impl<5UL,_const_char_*>.
            super__Head_base<5UL,_const_char_*,_false>._M_head_impl;
  _Var5._M_head_impl =
       local_488.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
       .super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  if (!bVar1) {
    testing::Message::Message(&local_510);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/test_zero_copy_stream_test.cc"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_510);
    pacVar4 = (char (*) [8])
              local_488.matchers_.
              super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
              .
              super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
              .super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
              super__Tuple_impl<3UL,_const_char_*,_const_char_*,_const_char_*>.
              super__Tuple_impl<4UL,_const_char_*,_const_char_*>.
              super__Tuple_impl<5UL,_const_char_*>.super__Head_base<5UL,_const_char_*,_false>.
              _M_head_impl;
    _Var5._M_head_impl =
         local_488.matchers_.
         super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
         .super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  local_529 = TestZeroCopyInputStream::Skip((TestZeroCopyInputStream *)&gtest_ar.message_,2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_528,&local_529,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_528,
               (AssertionResult *)"stream.Skip(2)","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/test_zero_copy_stream_test.cc"
               ,0x8c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_540,&local_538);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  pcVar3 = "HIJKLMN";
  testing::ElementsAre<char[2],char[4],char[1],char[1],char[8]>
            (&local_5c0,(testing *)0x1db7ab4,(char (*) [2])"EFG",
             (char (*) [4])(anon_var_dwarf_37cdd0 + 5),(char (*) [1])(anon_var_dwarf_37cdd0 + 5),
             (char (*) [1])"HIJKLMN",pacVar4);
  matcher_00.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<3UL,_const_char_*,_const_char_*>.super__Head_base<3UL,_const_char_*,_false>.
  _M_head_impl = local_5c0.matchers_.
                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
                 .super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
                 super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*>.
                 super__Head_base<2UL,_const_char_*,_false>._M_head_impl;
  matcher_00.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<3UL,_const_char_*,_const_char_*>.super__Tuple_impl<4UL,_const_char_*>.
  super__Head_base<4UL,_const_char_*,_false>._M_head_impl =
       (_Head_base<4UL,_const_char_*,_false>)
       (_Head_base<4UL,_const_char_*,_false>)
       local_5c0.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<3UL,_const_char_*,_const_char_*>.super__Head_base<3UL,_const_char_*,_false>
       ._M_head_impl;
  matcher_00.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<2UL,_const_char_*,_false>._M_head_impl =
       local_5c0.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  matcher_00.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       local_5c0.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  matcher_00.matchers_.
  super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl = _Var5._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*,char_const*>>>
            (matcher_00);
  TestZeroCopyInputStream::TestZeroCopyInputStream
            (&local_640,(TestZeroCopyInputStream *)&gtest_ar.message_);
  internal::(anonymous_namespace)::ReadLeftoverDoNotConsumeInput_abi_cxx11_
            (&local_5d8,(_anonymous_namespace_ *)&local_640,copy_02);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*,char_const*>>>
  ::operator()(local_570,local_598,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"ReadLeftoverDoNotConsumeInput(stream)");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5d8);
  TestZeroCopyInputStream::~TestZeroCopyInputStream(&local_640);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
  _Var5._M_head_impl =
       local_5c0.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  if (!bVar1) {
    testing::Message::Message(&local_648);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/test_zero_copy_stream_test.cc"
               ,0x8e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_648);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_648);
    _Var5._M_head_impl =
         local_5c0.matchers_.
         super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
         .super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
  local_661 = TestZeroCopyInputStream::Skip((TestZeroCopyInputStream *)&gtest_ar.message_,3);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_660,&local_661,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_660);
  if (!bVar1) {
    testing::Message::Message(&local_670);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_660,
               (AssertionResult *)"stream.Skip(3)","false","true",pcVar3);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/test_zero_copy_stream_test.cc"
               ,0x90,pcVar2);
    testing::internal::AssertHelper::operator=(&local_678,&local_670);
    testing::internal::AssertHelper::~AssertHelper(&local_678);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_660);
  testing::ElementsAre<char[2],char[1],char[1],char[8]>
            (&local_6e8,(testing *)0x1d62b15,(char (*) [2])(anon_var_dwarf_37cdd0 + 5),
             (char (*) [1])(anon_var_dwarf_37cdd0 + 5),(char (*) [1])"HIJKLMN",(char (*) [8])pcVar3)
  ;
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>.
  _M_head_impl = local_6e8.matchers_.
                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
                 super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
                 super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Tuple_impl<3UL,_const_char_*>.
  super__Head_base<3UL,_const_char_*,_false>._M_head_impl =
       (_Head_base<3UL,_const_char_*,_false>)
       (_Head_base<3UL,_const_char_*,_false>)
       local_6e8.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
       super__Tuple_impl<2UL,_const_char_*,_const_char_*>.super__Head_base<2UL,_const_char_*,_false>
       ._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       local_6e8.matchers_.
       super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
       super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*,_const_char_*>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl = _Var5._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
            (matcher);
  TestZeroCopyInputStream::TestZeroCopyInputStream
            (&local_768,(TestZeroCopyInputStream *)&gtest_ar.message_);
  internal::(anonymous_namespace)::ReadLeftoverDoNotConsumeInput_abi_cxx11_
            (&local_700,(_anonymous_namespace_ *)&local_768,copy_03);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*,char_const*,char_const*>>>
  ::operator()(local_6a8,local_6c8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"ReadLeftoverDoNotConsumeInput(stream)");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_700);
  TestZeroCopyInputStream::~TestZeroCopyInputStream(&local_768);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar1) {
    testing::Message::Message(&local_770);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/test_zero_copy_stream_test.cc"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_770);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_770);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  local_789 = TestZeroCopyInputStream::Skip((TestZeroCopyInputStream *)&gtest_ar.message_,8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_788,&local_789,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_788);
  if (!bVar1) {
    testing::Message::Message(&local_798);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5.message_,(internal *)local_788,
               (AssertionResult *)"stream.Skip(8)","false","true",pcVar3);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/test_zero_copy_stream_test.cc"
               ,0x94,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7a0,&local_798);
    testing::internal::AssertHelper::~AssertHelper(&local_7a0);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_788);
  testing::ElementsAre<>();
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<>>>();
  TestZeroCopyInputStream::TestZeroCopyInputStream
            (&local_858,(TestZeroCopyInputStream *)&gtest_ar.message_);
  internal::(anonymous_namespace)::ReadLeftoverDoNotConsumeInput_abi_cxx11_
            (&local_7f0,(_anonymous_namespace_ *)&local_858,copy_04);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<>>>::operator()
            (local_7d0,&local_7d1,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)"ReadLeftoverDoNotConsumeInput(stream)");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_7f0);
  TestZeroCopyInputStream::~TestZeroCopyInputStream(&local_858);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d0);
  if (!bVar1) {
    testing::Message::Message(&local_860);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/test_zero_copy_stream_test.cc"
               ,0x95,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_860);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_860);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
  local_879 = TestZeroCopyInputStream::Skip((TestZeroCopyInputStream *)&gtest_ar.message_,0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_878,&local_879,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_878);
  if (!bVar1) {
    testing::Message::Message(&local_888);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_878,
               (AssertionResult *)"stream.Skip(0)","false","true",pcVar3);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_890,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/test_zero_copy_stream_test.cc"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=(&local_890,&local_888);
    testing::internal::AssertHelper::~AssertHelper(&local_890);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_888);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_878);
  bVar1 = TestZeroCopyInputStream::Skip((TestZeroCopyInputStream *)&gtest_ar.message_,1);
  local_8c1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8c0,&local_8c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c0);
  if (!bVar1) {
    testing::Message::Message(&local_8d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_8f8,(internal *)local_8c0,(AssertionResult *)"stream.Skip(1)","true","false",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/test_zero_copy_stream_test.cc"
               ,0x99,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8d8,&local_8d0);
    testing::internal::AssertHelper::~AssertHelper(&local_8d8);
    std::__cxx11::string::~string((string *)&local_8f8);
    testing::Message::~Message(&local_8d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
  TestZeroCopyInputStream::~TestZeroCopyInputStream((TestZeroCopyInputStream *)&gtest_ar.message_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

TEST(TestZeroCopyInputStreamTest, SkipWorks) {
  std::vector<std::string> expected = {"ABC", "D", "EFG", "", "", "HIJKLMN"};
  TestZeroCopyInputStream stream(expected);

  EXPECT_THAT(ReadLeftoverDoNotConsumeInput(stream),
              ElementsAre("ABC", "D", "EFG", "", "", "HIJKLMN"));
  // Skip nothing
  EXPECT_TRUE(stream.Skip(0));
  EXPECT_THAT(ReadLeftoverDoNotConsumeInput(stream),
              ElementsAre("ABC", "D", "EFG", "", "", "HIJKLMN"));
  // Skip less than one chunk
  EXPECT_TRUE(stream.Skip(1));
  EXPECT_THAT(ReadLeftoverDoNotConsumeInput(stream),
              ElementsAre("BC", "D", "EFG", "", "", "HIJKLMN"));
  // Skip exactly one chunk
  EXPECT_TRUE(stream.Skip(2));
  EXPECT_THAT(ReadLeftoverDoNotConsumeInput(stream),
              ElementsAre("D", "EFG", "", "", "HIJKLMN"));
  // Skip cross chunks
  EXPECT_TRUE(stream.Skip(3));
  EXPECT_THAT(ReadLeftoverDoNotConsumeInput(stream),
              ElementsAre("G", "", "", "HIJKLMN"));
  // Skip the rest
  EXPECT_TRUE(stream.Skip(8));
  EXPECT_THAT(ReadLeftoverDoNotConsumeInput(stream), ElementsAre());
  // Skipping zero works on empty
  EXPECT_TRUE(stream.Skip(0));
  // but skipping non-zero does not
  EXPECT_FALSE(stream.Skip(1));
}